

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

ConstantsList * alloc_constant_listitem(Context *ctx)

{
  ConstantsList *pCVar1;
  
  pCVar1 = (ConstantsList *)Malloc(ctx,0x20);
  if (pCVar1 != (ConstantsList *)0x0) {
    *(undefined8 *)((long)&(pCVar1->constant).value + 8) = 0;
    (pCVar1->constant).type = MOJOSHADER_UNIFORM_FLOAT;
    (pCVar1->constant).index = 0;
    *(undefined8 *)&(pCVar1->constant).value = 0;
    pCVar1->next = ctx->constants;
    ctx->constants = pCVar1;
    ctx->constant_count = ctx->constant_count + 1;
  }
  return pCVar1;
}

Assistant:

static ConstantsList *alloc_constant_listitem(Context *ctx)
{
    ConstantsList *item = (ConstantsList *) Malloc(ctx, sizeof (ConstantsList));
    if (item == NULL)
        return NULL;

    memset(&item->constant, '\0', sizeof (MOJOSHADER_constant));
    item->next = ctx->constants;
    ctx->constants = item;
    ctx->constant_count++;

    return item;
}